

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool __thiscall absl::CondVar::WaitCommon(CondVar *this,Mutex *mutex,KernelTimeout t)

{
  ulong uVar1;
  bool bVar2;
  State SVar3;
  long lVar4;
  CondVar *mu;
  bool bVar5;
  undefined1 *how;
  SynchWaitParams waitp;
  
  how = kExclusiveS;
  if (((mutex->mu_).super___atomic_base<long>._M_i & 8U) == 0) {
    how = kSharedS;
  }
  uVar1 = *(ulong *)this;
  (*(code *)(anonymous_namespace)::cond_var_tracer)("Wait",this);
  if ((uVar1 & 2) != 0) {
    PostSynchEvent(this,10);
  }
  waitp.thread = &base_internal::CurrentThreadIdentityIfPresent()->per_thread_synch;
  if ((ThreadIdentity *)waitp.thread == (ThreadIdentity *)0x0) {
    waitp.thread = &synchronization_internal::CreateThreadIdentity()->per_thread_synch;
  }
  waitp.cond = (Condition *)0x0;
  waitp.how = (MuHow)how;
  waitp.timeout = t;
  waitp.cvmu = mutex;
  waitp.cv_word = (atomic<long> *)this;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar4 = rdtsc();
  }
  else {
    lVar4 = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  waitp.contention_start_cycles = lVar4 >> 2;
  mu = (CondVar *)mutex;
  Mutex::UnlockSlow(mutex,&waitp);
  bVar5 = false;
  SVar3 = ((waitp.thread)->state)._M_i;
  while (SVar3 == kQueued) {
    bVar2 = Mutex::DecrementSynchSem((Mutex *)mu,waitp.thread,t);
    if (!bVar2) {
      mu = this;
      Remove(this,waitp.thread);
      bVar5 = true;
      t.ns_ = 0;
    }
    SVar3 = ((waitp.thread)->state)._M_i;
  }
  if ((waitp.thread)->waitp == (SynchWaitParams *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0xa28,"Check %s failed: %s","waitp.thread->waitp != nullptr",
               "not waiting when should be");
  }
  (waitp.thread)->waitp = (SynchWaitParams *)0x0;
  (*(code *)(anonymous_namespace)::cond_var_tracer)("Unwait",this);
  if ((uVar1 & 2) != 0) {
    PostSynchEvent(this,0xb);
  }
  Mutex::LockSlow(mutex,(MuHow)how,(Condition *)0x0,3);
  return bVar5;
}

Assistant:

bool CondVar::WaitCommon(Mutex *mutex, KernelTimeout t) {
  bool rc = false;          // return value; true iff we timed-out

  intptr_t mutex_v = mutex->mu_.load(std::memory_order_relaxed);
  Mutex::MuHow mutex_how = ((mutex_v & kMuWriter) != 0) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(mutex, TsanFlags(mutex_how));

  // maybe trace this call
  intptr_t v = cv_.load(std::memory_order_relaxed);
  cond_var_tracer("Wait", this);
  if ((v & kCvEvent) != 0) {
    PostSynchEvent(this, SYNCH_EV_WAIT);
  }

  // Release mu and wait on condition variable.
  SynchWaitParams waitp(mutex_how, nullptr, t, mutex,
                        Synch_GetPerThreadAnnotated(mutex), &cv_);
  // UnlockSlow() will call CondVarEnqueue() just before releasing the
  // Mutex, thus queuing this thread on the condition variable.  See
  // CondVarEnqueue() for the reasons.
  mutex->UnlockSlow(&waitp);

  // wait for signal
  while (waitp.thread->state.load(std::memory_order_acquire) ==
         PerThreadSynch::kQueued) {
    if (!Mutex::DecrementSynchSem(mutex, waitp.thread, t)) {
      // DecrementSynchSem returned due to timeout.
      // Now we will either (1) remove ourselves from the wait list in Remove
      // below, in which case Remove will set thread.state = kAvailable and
      // we will not call DecrementSynchSem again; or (2) Signal/SignalAll
      // has removed us concurrently and is calling Wakeup, which will set
      // thread.state = kAvailable and post to the semaphore.
      // It's important to reset the timeout for the case (2) because otherwise
      // we can live-lock in this loop since DecrementSynchSem will always
      // return immediately due to timeout, but Signal/SignalAll is not
      // necessary set thread.state = kAvailable yet (and is not scheduled
      // due to thread priorities or other scheduler artifacts).
      // Note this could also be resolved if Signal/SignalAll would set
      // thread.state = kAvailable while holding the wait list spin lock.
      // But this can't be easily done for SignalAll since it grabs the whole
      // wait list with a single compare-exchange and does not really grab
      // the spin lock.
      t = KernelTimeout::Never();
      this->Remove(waitp.thread);
      rc = true;
    }
  }

  ABSL_RAW_CHECK(waitp.thread->waitp != nullptr, "not waiting when should be");
  waitp.thread->waitp = nullptr;  // cleanup

  // maybe trace this call
  cond_var_tracer("Unwait", this);
  if ((v & kCvEvent) != 0) {
    PostSynchEvent(this, SYNCH_EV_WAIT_RETURNING);
  }

  // From synchronization point of view Wait is unlock of the mutex followed
  // by lock of the mutex. We've annotated start of unlock in the beginning
  // of the function. Now, finish unlock and annotate lock of the mutex.
  // (Trans is effectively lock).
  ABSL_TSAN_MUTEX_POST_UNLOCK(mutex, TsanFlags(mutex_how));
  ABSL_TSAN_MUTEX_PRE_LOCK(mutex, TsanFlags(mutex_how));
  mutex->Trans(mutex_how);  // Reacquire mutex
  ABSL_TSAN_MUTEX_POST_LOCK(mutex, TsanFlags(mutex_how), 0);
  return rc;
}